

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O0

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>::~Holder
          (Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry> *this)

{
  QLoggingRegistry *in_RDI;
  char in_stack_ffffffffffffffdf;
  QLoggingRegistry *this_00;
  
  this_00 = in_RDI;
  pointer((Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry> *)in_RDI);
  QLoggingRegistry::~QLoggingRegistry(this_00);
  QBasicAtomicInteger<signed_char>::storeRelease
            ((QBasicAtomicInteger<signed_char> *)in_RDI,in_stack_ffffffffffffffdf);
  return;
}

Assistant:

~Holder()
    {
        // TSAN does not support atomic_thread_fence and GCC complains:
        // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=97868
        // https://github.com/google/sanitizers/issues/1352
        // QTBUG-134415
QT_WARNING_PUSH
#if defined(Q_CC_GNU_ONLY) && Q_CC_GNU >= 1100
QT_WARNING_DISABLE_GCC("-Wtsan")
#endif
        // import changes to *pointer() by other threads before running ~PlainType():
        std::atomic_thread_fence(std::memory_order_acquire);
QT_WARNING_POP
        pointer()->~PlainType();
        guard.storeRelease(QtGlobalStatic::Destroyed);
    }